

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O3

void __thiscall ChronoTest_Locale_Test::TestBody(ChronoTest_Locale_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char *pcVar4;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  seconds sec;
  AssertionResult gtest_ar;
  locale loc_5;
  tm time;
  locale loc;
  char *loc_name;
  undefined8 local_e8;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  long lStack_60;
  char *local_58;
  locale local_50 [8];
  undefined8 *local_48;
  code *local_40;
  char *local_30;
  
  local_30 = "ja_JP.utf8";
  std::locale::locale(local_50);
  std::locale::locale((locale *)&local_88,"ja_JP.utf8");
  std::locale::operator=(local_50,(locale *)&local_88);
  std::locale::~locale((locale *)&local_88);
  std::locale::locale((locale *)&local_e8,"ja_JP.utf8");
  local_88 = (long *)0x0;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  lStack_60 = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_58 = (char *)0x0;
  uStack_80._0_4_ = 0xe;
  uStack_80._4_4_ = 1;
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%OH",(locale *)&local_e8);
  local_d0 = 0xe;
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  format_str.size_ = 6;
  format_str.data_ = "{:%OH}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                ::TYPES;
  local_48 = &local_d0;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_e8,format_str,args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(make_hour(14), \"%OH\", loc)",
             "fmt::format(loc, \"{:\" \"%OH\" \"}\", std::chrono::hours(14))",&local_c8,&local_a8);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  paVar2 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_e8);
  std::locale::locale((locale *)&local_e8,"ja_JP.utf8");
  local_88 = (long *)0x0;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  lStack_60 = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_58 = (char *)0x0;
  uStack_80._0_4_ = 0xe;
  uStack_80._4_4_ = 1;
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%OI",(locale *)&local_e8);
  local_d0 = 0xe;
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  format_str_00.size_ = 6;
  format_str_00.data_ = "{:%OI}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_48 = &local_d0;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_e8,format_str_00,args_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(make_hour(14), \"%OI\", loc)",
             "fmt::format(loc, \"{:\" \"%OI\" \"}\", std::chrono::hours(14))",&local_c8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xaf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_e8);
  std::locale::locale((locale *)&local_e8,"ja_JP.utf8");
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  lStack_60 = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_58 = (char *)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 1;
  local_88 = (long *)0x2a00000000;
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%OM",(locale *)&local_e8);
  local_d0 = 0x2a;
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<60l,1l>>>;
  format_str_01.size_ = 6;
  format_str_01.data_ = "{:%OM}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<60l,1l>>>
       ::TYPES;
  local_48 = &local_d0;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_e8,format_str_01,args_01);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(make_minute(42), \"%OM\", loc)",
             "fmt::format(loc, \"{:\" \"%OM\" \"}\", std::chrono::minutes(42))",&local_c8,&local_a8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_e8);
  std::locale::locale((locale *)&local_e8,"ja_JP.utf8");
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  lStack_60 = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_58 = (char *)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 1;
  local_88 = (long *)0x2a;
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%OS",(locale *)&local_e8);
  local_d0 = 0x2a;
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{:%OS}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_48 = &local_d0;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_e8,format_str_02,args_02);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(make_second(42), \"%OS\", loc)",
             "fmt::format(loc, \"{:\" \"%OS\" \"}\", std::chrono::seconds(42))",&local_c8,&local_a8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_e8);
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  lStack_60 = 0;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_58 = (char *)0x0;
  local_88 = (long *)0x190000002d;
  uStack_80._0_4_ = 3;
  uStack_80._4_4_ = 1;
  local_e8 = 0x3039;
  std::locale::locale((locale *)&local_d0,"ja_JP.utf8");
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%r",(locale *)&local_d0);
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  format_str_03.size_ = 5;
  format_str_03.data_ = "{:%r}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_48 = &local_e8;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_d0,format_str_03,args_03);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(time, \"%r\", loc)","fmt::format(loc, \"{:\" \"%r\" \"}\", sec)",
             &local_c8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_c8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_d0);
  std::locale::locale((locale *)&local_d0,"ja_JP.utf8");
  format_tm_abi_cxx11_(&local_c8,(tm *)&local_88,"%p",(locale *)&local_d0);
  local_40 = fmt::v5::internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  format_str_04.size_ = 5;
  format_str_04.data_ = "{:%p}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_48 = &local_e8;
  fmt::v5::internal::vformat<char>(&local_a8,(locale *)&local_d0,format_str_04,args_04);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,"format_tm(time, \"%p\", loc)","fmt::format(loc, \"{:\" \"%p\" \"}\", sec)",
             &local_c8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_c8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale((locale *)&local_d0);
  std::locale::~locale(local_50);
  return;
}

Assistant:

TEST(ChronoTest, Locale) {
  const char *loc_name = "ja_JP.utf8";
  bool has_locale = false;
  std::locale loc;
  try {
    loc = std::locale(loc_name);
    has_locale = true;
  } catch (const std::runtime_error &) {}
  if (!has_locale) {
    fmt::print("{} locale is missing.\n", loc_name);
    return;
  }
  EXPECT_TIME("%OH", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OI", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OM", make_minute(42), std::chrono::minutes(42));
  EXPECT_TIME("%OS", make_second(42), std::chrono::seconds(42));
  auto time = make_tm();
  time.tm_hour = 3;
  time.tm_min = 25;
  time.tm_sec = 45;
  auto sec = std::chrono::seconds(12345);
  EXPECT_TIME("%r", time, sec);
  EXPECT_TIME("%p", time, sec);
}